

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O2

off_t mem_seek(hFILE *fpv,off_t offset,int whence)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  long lStack_10;
  
  uVar3 = -offset;
  if (0 < offset) {
    uVar3 = offset;
  }
  if (whence == 0) {
    uVar1 = 0;
  }
  else {
    if (whence == 1) {
      lStack_10 = 0x48;
    }
    else {
      if (whence != 2) goto LAB_0010ffa1;
      lStack_10 = 0x40;
    }
    uVar1 = *(ulong *)((long)&fpv->buffer + lStack_10);
  }
  if ((-1 < offset || uVar3 <= uVar1) && ((offset < 0 || (uVar3 <= (long)fpv[1].begin - uVar1)))) {
    fpv[1].end = (char *)(uVar1 + offset);
    return (off_t)(char *)(uVar1 + offset);
  }
LAB_0010ffa1:
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

static off_t mem_seek(hFILE *fpv, off_t offset, int whence)
{
    hFILE_mem *fp = (hFILE_mem *) fpv;
    size_t absoffset = (offset >= 0)? offset : -offset;
    size_t origin;

    switch (whence) {
    case SEEK_SET: origin = 0; break;
    case SEEK_CUR: origin = fp->pos; break;
    case SEEK_END: origin = fp->length; break;
    default: errno = EINVAL; return -1;
    }

    if ((offset  < 0 && absoffset > origin) ||
        (offset >= 0 && absoffset > fp->length - origin)) {
        errno = EINVAL;
        return -1;
    }

    fp->pos = origin + offset;
    return fp->pos;
}